

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

TestBench * __thiscall kratos::Context::testbench(Context *this,string *name)

{
  element_type *peVar1;
  _Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  *this_00;
  Context *local_40;
  shared_ptr<kratos::TestBench> local_38;
  undefined1 local_21;
  
  local_38.super___shared_ptr<kratos::TestBench,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (TestBench *)0x0;
  local_40 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::TestBench,std::allocator<kratos::TestBench>,kratos::Context*,std::__cxx11::string_const&>
            (&local_38.super___shared_ptr<kratos::TestBench,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(TestBench **)&local_38,(allocator<kratos::TestBench> *)&local_21,&local_40,name);
  std::__shared_ptr<kratos::TestBench,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::TestBench,kratos::TestBench>
            ((__shared_ptr<kratos::TestBench,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             local_38.super___shared_ptr<kratos::TestBench,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (_Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
             *)std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,name);
  std::
  _Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  ::_M_emplace_unique<std::shared_ptr<kratos::TestBench>const&>(this_00,&local_38);
  peVar1 = local_38.super___shared_ptr<kratos::TestBench,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_38.super___shared_ptr<kratos::TestBench,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<kratos::TestBench,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return peVar1;
}

Assistant:

TestBench &Context::testbench(const std::string &name) {
    auto const &p = std::make_shared<TestBench>(this, name);
    modules_[name].emplace(p);
    return *p;
}